

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_mov_mips64el
               (TCGContext_conflict6 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz)

{
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict6 *tcg_ctx_local;
  
  if (dofs == aofs) {
    check_size_align(oprsz,maxsz,dofs);
    if (oprsz < maxsz) {
      expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
    }
  }
  else {
    tcg_gen_gvec_2_mips64el(tcg_ctx,dofs,aofs,oprsz,maxsz,&tcg_gen_gvec_mov_mips64el::g);
  }
  return;
}

Assistant:

void tcg_gen_gvec_mov(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                      uint32_t oprsz, uint32_t maxsz)
{
    static const GVecGen2 g = {
        .fni8 = tcg_gen_mov_i64,
        .fniv = vec_mov2,
        .fno = gen_helper_gvec_mov,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };
    if (dofs != aofs) {
        tcg_gen_gvec_2(tcg_ctx, dofs, aofs, oprsz, maxsz, &g);
    } else {
        check_size_align(oprsz, maxsz, dofs);
        if (oprsz < maxsz) {
            expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
        }
    }
}